

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tag_scalar_vector.hpp
# Opt level: O2

string_t * __thiscall
cfgfile::tag_scalar_vector_t<int,cfgfile::string_trait_t>::print_abi_cxx11_
          (string_t *__return_storage_ptr__,void *this,int indent)

{
  format_t<int,cfgfile::string_trait_t> *pfVar1;
  undefined8 *puVar2;
  long *plVar3;
  bool bVar4;
  long *plVar5;
  undefined8 *puVar6;
  int *value_00;
  char cVar7;
  int *v;
  format_t<int,cfgfile::string_trait_t> *this_00;
  string_t value;
  string_t local_80;
  long local_60;
  long *local_58;
  string_t local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  bVar4 = tag_t<cfgfile::string_trait_t>::is_defined((tag_t<cfgfile::string_trait_t> *)this);
  if (bVar4) {
    local_60 = (long)indent;
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_80,(char)indent);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_80);
    cVar7 = (char)__return_storage_ptr__;
    std::__cxx11::string::push_back(cVar7);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    pfVar1 = *(format_t<int,cfgfile::string_trait_t> **)((long)this + 0x68);
    local_58 = (long *)this;
    for (this_00 = *(format_t<int,cfgfile::string_trait_t> **)((long)this + 0x60); plVar3 = local_58
        , this_00 != pfVar1; this_00 = this_00 + 4) {
      std::__cxx11::string::push_back(cVar7);
      format_t<int,cfgfile::string_trait_t>::to_string_abi_cxx11_(&local_80,this_00,value_00);
      to_cfgfile_format<cfgfile::string_trait_t>(&local_50,&local_80);
      std::__cxx11::string::operator=((string *)&local_80,(string *)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_80);
    }
    plVar5 = (long *)(**(code **)(*local_58 + 0x10))(local_58);
    if (*plVar5 != plVar5[1]) {
      std::__cxx11::string::push_back(cVar7);
      puVar6 = (undefined8 *)(**(code **)(*plVar3 + 0x10))(plVar3);
      puVar2 = (undefined8 *)puVar6[1];
      for (puVar6 = (undefined8 *)*puVar6; puVar6 != puVar2; puVar6 = puVar6 + 1) {
        (**(code **)(*(long *)*puVar6 + 0x18))(&local_80,(long *)*puVar6,indent + 1);
        std::__cxx11::string::append((string *)__return_storage_ptr__);
        std::__cxx11::string::~string((string *)&local_80);
      }
      local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
      std::__cxx11::string::_M_construct((ulong)&local_80,(char)local_60);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_80);
    }
    std::__cxx11::string::push_back(cVar7);
    std::__cxx11::string::push_back(cVar7);
  }
  return __return_storage_ptr__;
}

Assistant:

typename Trait::string_t print( int indent = 0 ) const override
	{
		typename Trait::string_t result;

		if( this->is_defined() )
		{
			result.append( typename Trait::string_t( indent,
				const_t< Trait >::c_tab ) );
			result.push_back( const_t< Trait >::c_begin_tag );
			result.append( this->name() );

			for( const T & v : m_values )
			{
				result.push_back( const_t< Trait >::c_space );

				typename Trait::string_t value =
					format_t< T, Trait >::to_string( v );

				value = to_cfgfile_format< Trait >( value );

				result.append( value );
			}

			if( !this->children().empty() )
			{
				result.push_back( const_t< Trait >::c_carriage_return );

				for( const tag_t< Trait > * tag : this->children() )
					result.append( tag->print( indent + 1 ) );

				result.append( typename Trait::string_t( indent,
					const_t< Trait >::c_tab ) );
			}

			result.push_back( const_t< Trait >::c_end_tag );
			result.push_back( const_t< Trait >::c_carriage_return );
		}

		return result;
	}